

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>
::
Matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
          (Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>
           *this,vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 *columns,Characteristic characteristic)

{
  Column_zp_settings *this_00;
  Characteristic characteristic_local;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  *columns_local;
  Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>
  *this_local;
  
  this_00 = (Column_zp_settings *)operator_new(0x58);
  Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>
  ::Column_zp_settings::Column_zp_settings(this_00,characteristic);
  *(Column_zp_settings **)this = this_00;
  Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>>
  ::
  Base_matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>>
              *)(this + 8),columns,*(Column_settings **)this);
  Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>
  ::_assert_options();
  return;
}

Assistant:

inline Matrix<PersistenceMatrixOptions>::Matrix(const std::vector<Container>& columns,
                                                Characteristic characteristic)
    : colSettings_(new Column_settings(characteristic)),
      matrix_(columns, colSettings_)
{
  static_assert(PersistenceMatrixOptions::is_of_boundary_type || !PersistenceMatrixOptions::has_vine_update ||
                    PersistenceMatrixOptions::has_column_pairings,
                "When no barcode is recorded with vine swaps for chain matrices, comparison functions for the columns "
                "have to be provided.");
  _assert_options();
}